

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

bool __thiscall ON_3fPoint::operator>(ON_3fPoint *this,ON_3fPoint *p)

{
  float fVar1;
  float fVar2;
  byte bVar3;
  
  fVar1 = this->x;
  fVar2 = p->x;
  bVar3 = 1;
  if (fVar1 <= fVar2) {
    if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) {
      bVar3 = 0;
    }
    else if (this->y <= p->y) {
      bVar3 = -(p->z < this->z) & -(this->y == p->y);
    }
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool ON_3fPoint::operator>( const ON_3fPoint& p ) const
{
  // dictionary order
  return ((x>p.x)?true:((x==p.x)?((y>p.y)?true:(y==p.y&&z>p.z)?true:false):false));
}